

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O1

void __thiscall
deqp::egl::GLES2ThreadedSharingTest::GLES2ThreadedSharingTest
          (GLES2ThreadedSharingTest *this,EglTestContext *context,TestConfig *config,char *name,
          char *description)

{
  bool bVar1;
  bool bVar2;
  undefined1 uVar3;
  undefined3 uVar4;
  int iVar5;
  int iVar6;
  deUint32 dVar7;
  
  TestCase::TestCase(&this->super_TestCase,context,name,description);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__GLES2ThreadedSharingTest_0215f2b0;
  bVar1 = config->serverSync;
  bVar2 = config->render;
  uVar3 = config->field_0x13;
  (this->m_config).useFenceSync = config->useFenceSync;
  (this->m_config).serverSync = bVar1;
  (this->m_config).render = bVar2;
  (this->m_config).field_0x13 = uVar3;
  bVar1 = config->singleContext;
  uVar4 = *(undefined3 *)&config->field_0x5;
  iVar5 = config->define;
  iVar6 = config->modify;
  (this->m_config).resourceType = config->resourceType;
  (this->m_config).singleContext = bVar1;
  *(undefined3 *)&(this->m_config).field_0x5 = uVar4;
  (this->m_config).define = iVar5;
  (this->m_config).modify = iVar6;
  this->m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  dVar7 = deStringHash(name);
  this->m_seed = dVar7;
  *(undefined8 *)&this->m_threadsStarted = 0;
  *(undefined4 *)((long)&this->m_beginTimeUs + 4) = 0;
  this->m_timeOutUs = 10000000;
  this->m_sleepTimeMs = 1;
  this->m_timeOutTimeUs = 0;
  (this->m_threads).
  super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_threads).
  super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_threads).
  super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_eglDisplay = (EGLDisplay)0x0;
  this->m_eglConfig = (EGLConfig)0x0;
  glw::Functions::Functions(&this->m_gl);
  return;
}

Assistant:

GLES2ThreadedSharingTest::GLES2ThreadedSharingTest (EglTestContext& context, const TestConfig& config, const char* name, const char* description)
	: TestCase			(context, name, description)
	, m_config			(config)
	, m_log				(m_testCtx.getLog())
	, m_seed			(deStringHash(name))
	, m_threadsStarted	(false)
	, m_threadsRunning	(false)
	, m_executionReady	(false)
	, m_requiresRestart	(false)
	, m_beginTimeUs		(0)
	, m_timeOutUs		(10000000)	// 10 seconds
	, m_sleepTimeMs		(1)			// 1 milliseconds
	, m_timeOutTimeUs	(0)
	, m_eglDisplay		(EGL_NO_DISPLAY)
	, m_eglConfig		(0)
{
}